

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  byte bVar1;
  Expr *pEVar2;
  ulong in_RAX;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  
  if ((char)pEList->nExpr == '<') {
    uVar3 = (ulong)*(int *)&pParse->db;
    bVar5 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      pEVar2 = pEList->a[0].pExpr;
      in_RAX = 0;
      do {
        if ((*(byte *)((long)&pParse->rc + in_RAX * 0x18 + 1) & 3) == 0) {
          if ((&pParse->pVdbe)[in_RAX * 3] == (Vdbe *)0x0) {
            if (pEVar2 == (Expr *)0x0) {
LAB_00187b86:
              in_RAX = (ulong)((int)in_RAX + 1);
              break;
            }
          }
          else if (pEVar2 != (Expr *)0x0) {
            lVar4 = 0;
            do {
              bVar1 = *(byte *)((long)&(&pParse->pVdbe)[in_RAX * 3]->db + lVar4);
              if (bVar1 == (&pEVar2->op)[lVar4]) {
                if ((ulong)bVar1 == 0) goto LAB_00187b86;
              }
              else if (""[bVar1] != ""[(&pEVar2->op)[lVar4]]) break;
              lVar4 = lVar4 + 1;
            } while( true );
          }
        }
        in_RAX = in_RAX + 1;
        bVar5 = in_RAX < uVar3;
      } while (in_RAX != uVar3);
    }
    if (bVar5) {
      return (int)in_RAX;
    }
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    const char *zCol;
    assert( !ExprHasProperty(pE, EP_IntValue) );
    zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      if( pEList->a[i].fg.eEName==ENAME_NAME
       && sqlite3_stricmp(pEList->a[i].zEName, zCol)==0
      ){
        return i+1;
      }
    }
  }
  return 0;
}